

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O3

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
VisitFunctionalExpression<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcosId>,std::initializer_list<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>>
          (EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
          *this,initializer_list<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> ea)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcosId>
  fc;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcosId>
  local_48;
  
  paVar1 = &local_48.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_48.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
  local_48.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_48.super_FunctionalConstraint.result_var_ = -1;
  local_48.super_FunctionalConstraint.ctx.value_ = CTX_NONE;
  local_48.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1
  ;
  local_48.super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AcosId>.args_.
  _M_elems[0] = (_Type)ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       ::Convert2Var((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                                      *)this,(Expr)((ea._M_array)->super_ExprBase).impl_);
  AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcosId>>
            (__return_storage_ptr__,this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p != paVar1)
  {
    operator_delete(local_48.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,CONCAT71(local_48.super_FunctionalConstraint.super_BasicConstraint.name_.
                              field_2._M_allocated_capacity._1_7_,
                              local_48.super_FunctionalConstraint.super_BasicConstraint.name_.
                              field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitFunctionalExpression(ExprArray ea) {
    FuncConstraint fc;
    Exprs2Vars(ea, fc.GetArguments());
    return AssignResult2Args( std::move(fc) );
  }